

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall
discordpp::ApplicationCommandData::ApplicationCommandData
          (ApplicationCommandData *this,ApplicationCommandData *param_1)

{
  ApplicationCommandData *param_1_local;
  ApplicationCommandData *this_local;
  
  ResolvedData::ResolvedData(&this->super_ResolvedData,&param_1->super_ResolvedData);
  field<discordpp::Snowflake>::field(&this->id,&param_1->id);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->name,&param_1->name);
  field<int>::field(&this->type,&param_1->type);
  omittable_field<discordpp::ResolvedData>::omittable_field(&this->resolved,&param_1->resolved);
  omittable_field<std::vector<discordpp::ApplicationCommandInteractionDataOption,_std::allocator<discordpp::ApplicationCommandInteractionDataOption>_>_>
  ::omittable_field(&this->options,&param_1->options);
  omittable_field<discordpp::Snowflake>::omittable_field(&this->guild_id,&param_1->guild_id);
  omittable_field<discordpp::Snowflake>::omittable_field(&this->target_id,&param_1->target_id);
  return;
}

Assistant:

ApplicationCommandData(
        omittable_field<std::map<Snowflake, User> > users = omitted,
        omittable_field<std::map<Snowflake, GuildMember> > members = omitted,
        omittable_field<std::map<Snowflake, Role> > roles = omitted,
        omittable_field<std::map<Snowflake, Channel> > channels = omitted,
        omittable_field<std::map<Snowflake, Message> > messages = omitted,
        omittable_field<std::map<Snowflake, Attachment> > attachments = omitted,
        field<Snowflake> id = uninitialized,
        field<std::string> name = uninitialized,
        field<int> type = uninitialized,
        omittable_field<ResolvedData> resolved = omitted,
        omittable_field<std::vector<ApplicationCommandInteractionDataOption> > options = omitted,
        omittable_field<Snowflake> guild_id = omitted,
        omittable_field<Snowflake> target_id = omitted
    ):
        ResolvedData(
            users,
            members,
            roles,
            channels,
            messages,
            attachments
        ),
        id(id),
        name(name),
        type(type),
        resolved(resolved),
        options(options),
        guild_id(guild_id),
        target_id(target_id)
    {}